

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasOneofField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint32 uVar1;
  uint32 uVar2;
  OneofDescriptor *oneof_descriptor;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  oneof_descriptor = FieldDescriptor::containing_oneof(field);
  uVar1 = GetOneofCase(this,message,oneof_descriptor);
  uVar2 = FieldDescriptor::number(field);
  return uVar1 == uVar2;
}

Assistant:

inline bool GeneratedMessageReflection::HasOneofField(
    const Message& message, const FieldDescriptor* field) const {
  return (GetOneofCase(message, field->containing_oneof()) == field->number());
}